

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

char * Kit_PlaFromTruth(void *p,uint *pTruth,int nVars,Vec_Int_t *vCover)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar6;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  uVar5 = uVar4;
  if (nVars < 6) {
    uVar4 = 1;
    uVar5 = uVar4;
  }
  do {
    iVar2 = (int)uVar4;
    if (iVar2 < 1) goto LAB_005d7c7e;
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pTruth[lVar1] == 0);
  if (iVar2 < 1) {
LAB_005d7c7e:
    pcVar6 = " 0\n";
  }
  else {
    do {
      iVar2 = (int)uVar5;
      if (iVar2 < 1) goto LAB_005d7c87;
      lVar1 = uVar5 - 1;
      uVar5 = uVar5 - 1;
    } while (pTruth[lVar1] == 0xffffffff);
    if (0 < iVar2) {
      uVar3 = Kit_TruthIsop(pTruth,nVars,vCover,0);
      if (1 < uVar3) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x15b,"char *Kit_PlaFromTruth(void *, unsigned int *, int, Vec_Int_t *)");
      }
      pcVar6 = Kit_PlaCreateFromIsop(p,nVars,vCover);
      if (uVar3 != 0) {
        Kit_PlaComplement(pcVar6);
      }
      return pcVar6;
    }
LAB_005d7c87:
    pcVar6 = " 1\n";
  }
  pcVar6 = Kit_PlaStoreSop(p,pcVar6);
  return pcVar6;
}

Assistant:

char * Kit_PlaFromTruth( void * p, unsigned * pTruth, int nVars, Vec_Int_t * vCover )
{
    Aig_MmFlex_t * pMan = (Aig_MmFlex_t *)p;
    char * pSop;
    int RetValue;
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 0\n" );
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 1\n" );
    RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 0 ); // 1 );
    assert( RetValue == 0 || RetValue == 1 );
    pSop = Kit_PlaCreateFromIsop( pMan, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pSop );
    return pSop;
}